

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.h
# Opt level: O0

SceneLight * __thiscall CGL::GLScene::PointLight::get_static_light(PointLight *this)

{
  Vector3D VVar1;
  PointLight *this_00;
  long in_RDI;
  PointLight *l;
  undefined1 in_stack_ffffffffffffff98 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 in_stack_ffffffffffffffa8;
  Vector3D local_38;
  
  this_00 = (PointLight *)operator_new(0x50);
  Vector3D::Vector3D(&local_38,(Vector3D *)(in_RDI + 0x10));
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff98,(Vector3D *)(in_RDI + 0x30));
  VVar1.field_0.field_0.y = (double)this_00;
  VVar1.field_0.field_0.x = (double)in_RDI;
  VVar1.field_0._16_8_ = in_stack_ffffffffffffff98._0_8_;
  VVar1.field_0._24_8_ = in_stack_ffffffffffffff98._8_8_;
  CGL::SceneObjects::PointLight::PointLight(this_00,VVar1,(Vector3D)in_stack_ffffffffffffffa8);
  return (SceneLight *)this_00;
}

Assistant:

SceneObjects::SceneLight *get_static_light() const {
    SceneObjects::PointLight *l = 
      new SceneObjects::PointLight(spectrum, position);
    return l;
  }